

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

string * testing::internal::StripTrailingSpaces(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  char *pcVar2;
  iterator iVar3;
  
  pcVar2 = (str->_M_dataplus)._M_p;
  iVar3._M_current = pcVar2 + str->_M_string_length;
  while (iVar3._M_current != pcVar2) {
    bVar1 = IsSpace(iVar3._M_current[-1]);
    if (!bVar1) break;
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (str,iVar3._M_current + -1);
    pcVar2 = (str->_M_dataplus)._M_p;
  }
  std::__cxx11::string::string(__return_storage_ptr__,str);
  return __return_storage_ptr__;
}

Assistant:

inline std::string StripTrailingSpaces(std::string str) {
  std::string::iterator it = str.end();
  while (it != str.begin() && IsSpace(*--it)) it = str.erase(it);
  return str;
}